

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O1

void vertical_scroll_page_inter_command_start_proc
               (Am_Object *command,int mouse_x,int mouse_y,Am_Object *ref_obj,Am_Input_Char param_5)

{
  Am_Object AStack_28;
  Am_Object local_20;
  
  Am_Object::Am_Object(&local_20,command);
  Am_Object::Am_Object(&AStack_28,ref_obj);
  scroll_page_inter_command_start(&local_20,true,&AStack_28,mouse_x,mouse_y);
  Am_Object::~Am_Object(&AStack_28);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void,
                 vertical_scroll_page_inter_command_start,
                 (Am_Object command, int mouse_x, int mouse_y,
                  Am_Object ref_obj, Am_Input_Char /* ic */))
{
  scroll_page_inter_command_start(command, true, ref_obj, mouse_x, mouse_y);
}